

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seed_material.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::random_internal::ReadSeedMaterialFromOSEntropy
          (random_internal *this,Span<unsigned_int> values)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  size_type sVar4;
  size_type extraout_RDX;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  size_t __nbytes;
  uint8_t *buffer;
  random_internal *prVar8;
  
  sVar4 = values.len_;
  if (this == (random_internal *)0x0) {
    __assert_fail("values.data() != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/random/internal/seed_material.cc"
                  ,0xce,
                  "bool absl::random_internal::ReadSeedMaterialFromOSEntropy(absl::Span<uint32_t>)")
    ;
  }
  if (values.ptr_ != (pointer)0x0) {
    __nbytes = (long)values.ptr_ << 2;
    prVar8 = this;
    for (uVar5 = __nbytes; uVar5 != 0; uVar5 = uVar5 - uVar7) {
      uVar7 = 0x100;
      if (uVar5 < 0x100) {
        uVar7 = uVar5;
      }
      iVar1 = getentropy(prVar8,uVar7,sVar4);
      if (iVar1 < 0) {
        iVar1 = open("/dev/urandom",0);
        if (iVar1 == -1) {
          return false;
        }
        do {
          sVar2 = read(iVar1,this,__nbytes);
          if (sVar2 < 1) {
            piVar3 = __errno_location();
            bVar6 = *piVar3 == 4 && sVar2 == -1;
          }
          else {
            this = this + sVar2;
            __nbytes = __nbytes - sVar2;
            bVar6 = true;
          }
        } while ((bVar6 != false) && (__nbytes != 0));
        close(iVar1);
        return bVar6;
      }
      prVar8 = prVar8 + uVar7;
      sVar4 = extraout_RDX;
    }
  }
  return true;
}

Assistant:

bool ReadSeedMaterialFromOSEntropy(absl::Span<uint32_t> values) {
  assert(values.data() != nullptr);
  if (values.data() == nullptr) {
    return false;
  }
  if (values.empty()) {
    return true;
  }
  return ReadSeedMaterialFromOSEntropyImpl(values);
}